

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O1

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>
               (vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                *container)

{
  pointer ppFVar1;
  __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
  temp;
  pointer ppFVar2;
  
  if (container !=
      (vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
       *)0x0) {
    ppFVar1 = (container->
              super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar2 = (container->
                   super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1;
        ppFVar2 = ppFVar2 + 1) {
      if (*ppFVar2 != (FileDescriptorProto *)0x0) {
        (*((*ppFVar2)->super_Message).super_MessageLite._vptr_MessageLite[1])();
      }
    }
    ppFVar2 = (container->
              super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      (container->
      super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar2;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}